

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O0

int size<entityx::EntityManager::UnpackingView<Position>>(UnpackingView<Position> *t)

{
  bool bVar1;
  Entity i;
  Iterator __end0;
  Iterator __begin0;
  UnpackingView<Position> *__range1;
  int n;
  Entity in_stack_ffffffffffffff78;
  UnpackingView<Position> *in_stack_ffffffffffffffa0;
  ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false> local_48;
  int local_c;
  
  local_c = 0;
  entityx::EntityManager::UnpackingView<Position>::begin
            ((UnpackingView<Position> *)in_stack_ffffffffffffff78.id_.id_.id_);
  entityx::EntityManager::UnpackingView<Position>::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = entityx::EntityManager::
            ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>::
            operator!=(&local_48,(Iterator *)&stack0xffffffffffffff88);
    if (!bVar1) break;
    in_stack_ffffffffffffff78 =
         entityx::EntityManager::
         ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>::operator*
                   ((ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>
                     *)in_stack_ffffffffffffff78.id_.id_.id_);
    local_c = local_c + 1;
    entityx::EntityManager::
    ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>::operator++
              ((ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false> *)
               in_stack_ffffffffffffff78.id_.id_.id_);
  }
  return local_c;
}

Assistant:

int size(const T &t) {
  int n = 0;
  for (auto i : t) {
    ++n;
    (void)i;  // Unused on purpose, suppress warning
  }
  return n;
}